

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputePipeline.cpp
# Opt level: O2

Ptr<ComputePipeline> __thiscall
myvk::ComputePipeline::Create
          (ComputePipeline *this,Ptr<PipelineLayout> *pipeline_layout,
          Ptr<ShaderModule> *shader_module,VkSpecializationInfo *p_specialization_info)

{
  VkDevice pVVar1;
  PFN_vkCreateComputePipelines p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  int iVar4;
  VkResult VVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr<ComputePipeline> PVar6;
  shared_ptr<myvk::ComputePipeline> ret;
  VkComputePipelineCreateInfo create_info;
  VkPipelineShaderStageCreateInfo local_58;
  
  std::make_shared<myvk::ComputePipeline>();
  std::__shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&((ret.super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_PipelineBase).m_pipeline_layout_ptr.
              super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>,
             &pipeline_layout->super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>)
  ;
  create_info.pNext = (void *)0x0;
  create_info.basePipelineHandle = (VkPipeline)0x0;
  create_info.basePipelineIndex = 0;
  create_info._92_4_ = 0;
  create_info.stage.pSpecializationInfo = (VkSpecializationInfo *)0x0;
  create_info.stage.module = (VkShaderModule)0x0;
  create_info.stage.pName = (char *)0x0;
  create_info.stage.pNext = (void *)0x0;
  create_info.stage.flags = 0;
  create_info.stage.stage = 0;
  create_info.flags = 0;
  create_info._20_4_ = 0;
  create_info.stage.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  create_info.stage._4_4_ = 0;
  create_info.sType = VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO;
  create_info._4_4_ = 0;
  create_info.layout =
       ((pipeline_layout->super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr)->m_pipeline_layout;
  ShaderModule::GetPipelineShaderStageCreateInfo
            (&local_58,
             (shader_module->super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr,VK_SHADER_STAGE_COMPUTE_BIT,p_specialization_info);
  p_Var2 = vkCreateComputePipelines;
  iVar4 = (*(((pipeline_layout->super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  pVVar1 = *(VkDevice *)(*(long *)CONCAT44(extraout_var,iVar4) + 0x268);
  iVar4 = (*(((pipeline_layout->super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  VVar5 = (*p_Var2)(pVVar1,*(VkPipelineCache *)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x270),1,
                    &create_info,(VkAllocationCallbacks *)0x0,
                    &((ret.super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->super_PipelineBase).m_pipeline);
  _Var3 = ret.super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  if (VVar5 == VK_SUCCESS) {
    ret.super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_PipelineBase).super_DeviceObjectBase.super_Base._vptr_Base =
         (_func_int **)
         ret.super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_PipelineBase).super_DeviceObjectBase.super_Base.
    super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)_Var3._M_pi;
    ret.super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    (this->super_PipelineBase).super_DeviceObjectBase.super_Base._vptr_Base = (_func_int **)0x0;
    (this->super_PipelineBase).super_DeviceObjectBase.super_Base.
    super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ret.super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  PVar6.super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar6.super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<ComputePipeline>)
         PVar6.super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<ComputePipeline> ComputePipeline::Create(const Ptr<PipelineLayout> &pipeline_layout,
                                             const Ptr<ShaderModule> &shader_module,
                                             VkSpecializationInfo *p_specialization_info) {
	std::shared_ptr<ComputePipeline> ret = std::make_shared<ComputePipeline>();
	ret->m_pipeline_layout_ptr = pipeline_layout;

	VkComputePipelineCreateInfo create_info = {};
	create_info.sType = VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO;
	create_info.layout = pipeline_layout->GetHandle();
	create_info.stage =
	    shader_module->GetPipelineShaderStageCreateInfo(VK_SHADER_STAGE_COMPUTE_BIT, p_specialization_info);

	if (vkCreateComputePipelines(pipeline_layout->GetDevicePtr()->GetHandle(),
	                             pipeline_layout->GetDevicePtr()->GetPipelineCacheHandle(), 1, &create_info, nullptr,
	                             &ret->m_pipeline) != VK_SUCCESS)
		return nullptr;
	return ret;
}